

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O2

void __thiscall
ExecutorRegVm::ExecCheckedReturn(ExecutorRegVm *this,uint typeId,RegVmRegister *regFilePtr)

{
  int iVar1;
  long lVar2;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *paVar3;
  anon_union_8_3_3250f155_for_RegVmRegister_0 __src;
  ExternTypeInfo *pEVar4;
  anon_union_8_3_3250f155_for_RegVmRegister_0 aVar5;
  ExternTypeInfo *pEVar6;
  uint uVar7;
  
  aVar5 = regFilePtr[1].field_0;
  uVar7 = (this->dataStack).count;
  lVar2 = (regFilePtr->field_0).longValue;
  pEVar4 = FastVector<ExternTypeInfo,_false,_false>::operator[](&this->exLinker->exTypes,typeId);
  paVar3 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)this->tempStackArrayBase;
  __src = *(anon_union_8_3_3250f155_for_RegVmRegister_0 *)&paVar3->intValue;
  if (((ulong)aVar5 <= (ulong)__src) && ((ulong)__src <= (ulong)uVar7 + lVar2)) {
    NULLC::SetCollectMemory(false);
    if ((pEVar4->field_8).arrSize == 0xffffffff) {
      iVar1 = paVar3[1].intValue;
      pEVar6 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         (&this->exLinker->exTypes,(pEVar4->field_11).subType);
      aVar5 = (anon_union_8_3_3250f155_for_RegVmRegister_0)
              NULLC::AllocObject(pEVar6->size * iVar1,(pEVar4->field_11).subType);
      pEVar4 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         (&this->exLinker->exTypes,(pEVar4->field_11).subType);
      uVar7 = iVar1 * pEVar4->size;
    }
    else {
      uVar7 = pEVar4->size;
      aVar5 = (anon_union_8_3_3250f155_for_RegVmRegister_0)NULLC::AllocObject(uVar7,typeId);
    }
    memcpy((void *)aVar5,(void *)__src,(ulong)uVar7);
    *paVar3 = aVar5;
    NULLC::SetCollectMemory(true);
    return;
  }
  return;
}

Assistant:

void ExecutorRegVm::ExecCheckedReturn(unsigned typeId, RegVmRegister * const regFilePtr)
{
	uintptr_t frameBase = regFilePtr[rvrrFrame].ptrValue;
	uintptr_t frameEnd = regFilePtr[rvrrGlobals].ptrValue + dataStack.size();

	ExternTypeInfo &type = exLinker->exTypes[typeId];

	char *returnValuePtr = (char*)tempStackArrayBase;

	void *ptr = vmLoadPointer(returnValuePtr);

	if(uintptr_t(ptr) >= frameBase && uintptr_t(ptr) <= frameEnd)
	{
		// Don't want to trigger GC at this point
		NULLC::SetCollectMemory(false);

		if(type.arrSize == ~0u)
		{
			unsigned length = *(int*)(returnValuePtr + sizeof(void*));

			char *copy = (char*)NULLC::AllocObject(exLinker->exTypes[type.subType].size * length, type.subType);
			memcpy(copy, ptr, unsigned(exLinker->exTypes[type.subType].size * length));
			vmStorePointer(returnValuePtr, copy);
		}
		else
		{
			unsigned objSize = type.size;

			char *copy = (char*)NULLC::AllocObject(objSize, typeId);
			memcpy(copy, ptr, objSize);
			vmStorePointer(returnValuePtr, copy);
		}

		NULLC::SetCollectMemory(true);
	}
}